

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_3.cpp
# Opt level: O2

string * remove_vowels(string *__return_storage_ptr__,string *line)

{
  char ch;
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  size_type sVar4;
  ostringstream oss;
  ostringstream aoStack_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  pcVar1 = (line->_M_dataplus)._M_p;
  sVar2 = line->_M_string_length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    ch = pcVar1[sVar4];
    bVar3 = is_vowel(ch);
    if (!bVar3) {
      std::operator<<((ostream *)aoStack_1a8,ch);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string remove_vowels(const std::string& line)
{
	std::ostringstream oss;
	for (auto& ch : line)
	{
		if (!is_vowel(ch))
		{
			oss << ch;
		}
	}
	return oss.str();
}